

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall SimpleString::SimpleString(SimpleString *this,char *other,size_t repeatCount)

{
  size_t sVar1;
  ulong in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  size_t i;
  char *next;
  size_t otherStringLength;
  SimpleString *in_stack_ffffffffffffffd0;
  ulong uVar2;
  char *local_28;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  sVar1 = StrLen(in_RSI);
  setInternalBufferToNewBuffer(in_stack_ffffffffffffffd0,(size_t)in_RDI);
  local_28 = (char *)*in_RDI;
  for (uVar2 = 0; uVar2 < in_RDX; uVar2 = uVar2 + 1) {
    StrNCpy(local_28,in_RSI,sVar1 + 1);
    local_28 = local_28 + sVar1;
  }
  *local_28 = '\0';
  return;
}

Assistant:

SimpleString::SimpleString(const char *other, size_t repeatCount)
    : buffer_(NULLPTR), bufferSize_(0)
{
    size_t otherStringLength = StrLen(other);
    setInternalBufferToNewBuffer(otherStringLength * repeatCount + 1);

    char* next = buffer_;
    for (size_t i = 0; i < repeatCount; i++) {
        StrNCpy(next, other, otherStringLength + 1);
        next += otherStringLength;
    }
    *next = 0;
}